

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_call(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA **ppCVar1;
  short sVar2;
  string_view fmt;
  bool bVar3;
  int iVar4;
  int iVar5;
  CClass *pCVar6;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  CHAR_DATA *in_RDI;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  int target;
  int sn;
  int where;
  int mana;
  void *vo;
  EXIT_DATA *pexit;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  undefined4 in_stack_ffffffffffffc948;
  int in_stack_ffffffffffffc94c;
  CHAR_DATA *in_stack_ffffffffffffc950;
  CHAR_DATA *in_stack_ffffffffffffc958;
  uint in_stack_ffffffffffffc960;
  int in_stack_ffffffffffffc964;
  CHAR_DATA *in_stack_ffffffffffffc968;
  skill_type *args;
  undefined4 in_stack_ffffffffffffc988;
  size_t in_stack_ffffffffffffc990;
  char *in_stack_ffffffffffffc998;
  CHAR_DATA *pCVar10;
  int local_3650;
  int local_364c;
  int local_3648;
  int local_3644;
  int local_3640;
  int local_363c;
  CHAR_DATA *local_3638;
  CHAR_DATA *local_3630;
  CHAR_DATA *local_3628;
  CHAR_DATA *local_3620;
  char local_3618;
  int in_stack_ffffffffffffca24;
  undefined1 in_stack_ffffffffffffca2b;
  int in_stack_ffffffffffffca2c;
  CHAR_DATA *in_stack_ffffffffffffca30;
  int in_stack_ffffffffffffca4c;
  CHAR_DATA *in_stack_ffffffffffffca50;
  int in_stack_ffffffffffffcb74;
  CHAR_DATA *in_stack_ffffffffffffcb78;
  CHAR_DATA *in_stack_ffffffffffffcb80;
  char *in_stack_ffffffffffffdb50;
  CHAR_DATA *in_stack_ffffffffffffdb58;
  char *in_stack_ffffffffffffdb60;
  CHAR_DATA *in_stack_ffffffffffffdb68;
  char local_2418;
  char *in_stack_ffffffffffffed50;
  char *in_stack_ffffffffffffed58;
  CHAR_DATA local_1218 [5];
  CHAR_DATA *local_8;
  
  local_8 = in_RDI;
  bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
  if ((bVar3) && (local_8->desc == (DESCRIPTOR_DATA *)0x0)) {
    return;
  }
  target_name = one_argument((char *)in_stack_ffffffffffffc950,
                             (char *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
  one_argument((char *)in_stack_ffffffffffffc950,
               (char *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
  if (local_2418 == '\0') {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
    return;
  }
  local_3644 = find_spell(in_stack_ffffffffffffc968,
                          (char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960));
  if ((((local_3644 < 1) || (skill_table[local_3644].spell_fun == spell_null)) ||
      ((bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)),
       !bVar3 && (iVar4 = get_skill(in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c), iVar4 < 5)
       ))) || ((bVar3 = is_npc((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)),
               !bVar3 && (local_8->pcdata->learned[local_3644] == 0)))) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
    return;
  }
  if ((local_8->position < skill_table[local_3644].minimum_position) &&
     (iVar4 = get_trust((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)),
     iVar4 < 0x3b)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
    return;
  }
  if ((skill_table[local_3644].ctype != 3) &&
     (bVar3 = is_immortal((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)
                         ), !bVar3)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
    return;
  }
  bVar3 = cabal_down(in_stack_ffffffffffffc950,in_stack_ffffffffffffc94c);
  if (bVar3) {
    return;
  }
  iVar4 = local_8->level + 2;
  args = skill_table + local_3644;
  pCVar6 = char_data::Class((char_data *)
                            CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960));
  iVar5 = CClass::GetIndex(pCVar6);
  if (iVar4 == args->skill_level[iVar5]) {
    local_363c = 0x32;
  }
  else {
    local_364c = (int)skill_table[local_3644].min_mana;
    sVar2 = local_8->level;
    lVar9 = (long)local_3644;
    pCVar6 = char_data::Class((char_data *)
                              CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960));
    iVar5 = CClass::GetIndex(pCVar6);
    local_3650 = (int)(100 / (long)((sVar2 + 2) -
                                   (int)*(short *)(lVar9 * 0x60 + 0x8daef8 + (long)iVar5 * 2)));
    piVar7 = std::max<int>(&local_364c,&local_3650);
    local_363c = *piVar7;
  }
  local_3620 = (CHAR_DATA *)0x0;
  local_3628 = (CHAR_DATA *)0x0;
  local_3638 = (CHAR_DATA *)0x0;
  local_3648 = 3;
  switch(skill_table[local_3644].target) {
  case 0:
    break;
  case 1:
  case 9:
    if (local_3618 == '\0') {
      local_3620 = local_8->fighting;
      if (local_3620 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
    }
    else {
      local_3620 = get_char_room(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      if (local_3620 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
    }
    bVar3 = is_affected_by(in_stack_ffffffffffffc958,(int)((ulong)in_stack_ffffffffffffc950 >> 0x20)
                          );
    if ((bVar3) && (local_8->master == local_3620)) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      return;
    }
    local_3638 = local_3620;
    local_3648 = 0;
    break;
  case 2:
    if (local_3618 == '\0') {
      local_3620 = local_8;
    }
    else {
      local_3620 = get_char_room(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      if (local_3620 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
    }
    local_3638 = local_3620;
    local_3648 = 0;
    break;
  case 3:
    if ((local_3618 != '\0') &&
       (bVar3 = is_name(in_stack_ffffffffffffed58,in_stack_ffffffffffffed50), !bVar3)) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      return;
    }
    local_3638 = local_8;
    local_3648 = 0;
    break;
  case 4:
    if (local_3618 == '\0') {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      return;
    }
    local_3628 = (CHAR_DATA *)
                 get_obj_carry(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,
                               in_stack_ffffffffffffdb58);
    if (local_3628 == (CHAR_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      return;
    }
    local_3648 = 1;
    local_3638 = local_3628;
    break;
  case 5:
    if (local_3618 == '\0') {
      local_3638 = local_8;
      local_3648 = 0;
    }
    else {
      local_3620 = get_char_room(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      if (local_3620 == (CHAR_DATA *)0x0) {
        local_3628 = (CHAR_DATA *)
                     get_obj_carry(in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60,
                                   in_stack_ffffffffffffdb58);
        if (local_3628 == (CHAR_DATA *)0x0) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                       in_stack_ffffffffffffc958);
          return;
        }
        local_3648 = 1;
        local_3638 = local_3628;
      }
      else {
        local_3648 = 0;
        local_3638 = local_3620;
      }
    }
    break;
  case 6:
    if (local_3618 == '\0') {
      local_3620 = local_8->fighting;
      if (local_3620 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
      local_3648 = 0;
    }
    else {
      local_3620 = get_char_room(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      if (local_3620 != (CHAR_DATA *)0x0) {
        local_3648 = 0;
      }
    }
    if (local_3648 == 0) {
      bVar3 = is_affected_by(in_stack_ffffffffffffc958,
                             (int)((ulong)in_stack_ffffffffffffc950 >> 0x20));
      if ((bVar3) && (local_8->master == local_3620)) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
      local_3638 = local_3620;
    }
    else {
      local_3628 = (CHAR_DATA *)
                   get_obj_here(in_stack_ffffffffffffc958,(char *)in_stack_ffffffffffffc950);
      if (local_3628 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                     in_stack_ffffffffffffc958);
        return;
      }
      local_3648 = 1;
      local_3638 = local_3628;
    }
    break;
  case 7:
    local_3640 = direction_lookup((char *)in_stack_ffffffffffffc950);
    local_3630 = (CHAR_DATA *)local_8->in_room->exit[local_3640];
    if ((local_3640 < 0) || (local_3630 == (CHAR_DATA *)0x0)) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      return;
    }
    local_3648 = 5;
    local_3638 = (CHAR_DATA *)&local_3640;
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
               (char *)in_stack_ffffffffffffc958);
    fmt._M_str = in_stack_ffffffffffffc998;
    fmt._M_len = in_stack_ffffffffffffc990;
    CLogger::Warn<int&>((CLogger *)CONCAT44(iVar4,in_stack_ffffffffffffc988),fmt,(int *)args);
    return;
  }
  bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
  if ((!bVar3) && (local_8->mana < local_363c)) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 in_stack_ffffffffffffc958);
    return;
  }
  WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
             (int)((ulong)in_stack_ffffffffffffc958 >> 0x20));
  bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
  if (!bVar3) {
    in_stack_ffffffffffffc964 = number_percent();
    iVar4 = get_skill(in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c);
    if (iVar4 < in_stack_ffffffffffffc964) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                   in_stack_ffffffffffffc958);
      if (local_3644 != gsn_rage) {
        check_improve(in_stack_ffffffffffffca30,in_stack_ffffffffffffca2c,
                      (bool)in_stack_ffffffffffffca2b,in_stack_ffffffffffffca24);
      }
      local_8->mana = local_8->mana - (short)(local_363c / 2);
      goto LAB_006618d8;
    }
  }
  local_8->mana = local_8->mana - (short)local_363c;
  if ((skill_table[local_3644].target == 1) &&
     (bVar3 = is_safe(in_stack_ffffffffffffc950,
                      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)),
     bVar3)) {
    return;
  }
  if (skill_table[local_3644].target == 1) {
    bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
    if (((!bVar3) &&
        (bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948)),
        !bVar3)) &&
       ((local_8->fighting == (CHAR_DATA *)0x0 || (local_3620->fighting == (CHAR_DATA *)0x0)))) {
      in_stack_ffffffffffffc960 =
           number_range((int)in_stack_ffffffffffffc950,in_stack_ffffffffffffc94c);
      if (in_stack_ffffffffffffc960 < 2) {
        in_stack_ffffffffffffc958 = local_1218;
        pcVar8 = pers(in_stack_ffffffffffffc958,in_stack_ffffffffffffc950);
        sprintf((char *)in_stack_ffffffffffffc958,"Die, %s you sorcerous dog!",pcVar8);
      }
      else if (in_stack_ffffffffffffc960 == 2) {
        in_stack_ffffffffffffc950 = local_1218;
        pcVar8 = pers(in_stack_ffffffffffffc958,in_stack_ffffffffffffc950);
        sprintf((char *)in_stack_ffffffffffffc950,"Help! %s is casting a spell on me!",pcVar8);
      }
      if ((local_3620 != local_8) &&
         (bVar3 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948))
         , !bVar3)) {
        do_myell((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
                 (char *)in_stack_ffffffffffffc958,in_stack_ffffffffffffc950);
      }
    }
    bVar3 = check_volley(local_8,local_3620);
    if (bVar3) {
      act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
          in_stack_ffffffffffffc958,in_stack_ffffffffffffc950,
          (void *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948),0);
      act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
          in_stack_ffffffffffffc958,in_stack_ffffffffffffc950,
          (void *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948),0);
      act((char *)CONCAT44(in_stack_ffffffffffffc964,in_stack_ffffffffffffc960),
          in_stack_ffffffffffffc958,in_stack_ffffffffffffc950,
          (void *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948),0);
      (*skill_table[local_3644].spell_fun)
                (local_3644,(int)local_8->level << 1,local_3620,local_8,local_3648);
      return;
    }
  }
  (*skill_table[local_3644].spell_fun)(local_3644,(int)local_8->level,local_8,local_3638,local_3648)
  ;
  check_improve(in_stack_ffffffffffffca30,in_stack_ffffffffffffca2c,(bool)in_stack_ffffffffffffca2b,
                in_stack_ffffffffffffca24);
LAB_006618d8:
  if ((((skill_table[local_3644].target == 1) ||
       ((skill_table[local_3644].target == 6 && (local_3648 == 0)))) && (local_3620 != local_8)) &&
     (local_3620->master != local_8)) {
    un_blade_barrier(in_stack_ffffffffffffc950,
                     (char *)CONCAT44(in_stack_ffffffffffffc94c,in_stack_ffffffffffffc948));
    pCVar10 = local_8->in_room->people;
    do {
      if (pCVar10 == (CHAR_DATA *)0x0) {
        return;
      }
      ppCVar1 = &pCVar10->next_in_room;
      bVar3 = local_3620 != pCVar10;
      pCVar10 = *ppCVar1;
    } while ((bVar3) || (local_3620->fighting != (CHAR_DATA *)0x0));
    multi_hit(in_stack_ffffffffffffcb80,in_stack_ffffffffffffcb78,in_stack_ffffffffffffcb74);
  }
  return;
}

Assistant:

void do_call(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *obj;
	EXIT_DATA *pexit;
	void *vo;
	int mana, where;
	int sn;
	int target;

	if (is_npc(ch) && ch->desc == nullptr)
		return;

	target_name = one_argument(argument, arg1);

	one_argument(target_name, arg2);

	if (arg1[0] == '\0')
	{
		send_to_char("Call which what where?\n\r", ch);
		return;
	}

	sn = find_spell(ch, arg1);

	if (sn < 1
		|| skill_table[sn].spell_fun == spell_null
		|| (!is_npc(ch) && get_skill(ch, sn) < 5)
		|| (!is_npc(ch) && ch->pcdata->learned[sn] == 0))
	{
		send_to_char("You don't know any powers of that name.\n\r", ch);
		return;
	}

	if (ch->position < skill_table[sn].minimum_position && get_trust(ch) < MAX_LEVEL - 1)
	{
		send_to_char("You can't concentrate enough.\n\r", ch);
		return;
	}

	if (skill_table[sn].ctype != CMD_POWER && !is_immortal(ch))
	{
		send_to_char("You can't call that.\n\r", ch);
		return;
	}

	if (cabal_down(ch, ch->cabal))
		return;

	if (ch->level + 2 == skill_table[sn].skill_level[ch->Class()->GetIndex()])
		mana = 50;
	else
		mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - skill_table[sn].skill_level[ch->Class()->GetIndex()]));

	/*
	 * Locate targets.
	 */
	victim = nullptr;
	obj = nullptr;
	vo = nullptr;
	target = TARGET_NONE;

	switch (skill_table[sn].target)
	{
		case TAR_IGNORE:
			break;
		case TAR_CHAR_GENERAL:
		case TAR_CHAR_OFFENSIVE:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on whom?\n\r", ch);
					return;
				}
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
			{
				send_to_char("You can't do that on your own master.\n\r", ch);
				return;
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_DEFENSIVE:
			if (arg2[0] == '\0')
				victim = ch;
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim == nullptr)
				{
					send_to_char("They aren't here.\n\r", ch);
					return;
				}
			}

			vo = (void *)victim;
			target = TARGET_CHAR;
			break;
		case TAR_CHAR_SELF:
			if (arg2[0] != '\0' && !is_name(target_name, ch->name))
			{
				send_to_char("You cannot call this power on another.\n\r", ch);
				return;
			}

			vo = (void *)ch;
			target = TARGET_CHAR;
			break;
		case TAR_OBJ_INV:
			if (arg2[0] == '\0')
			{
				send_to_char("What should the power be called upon?\n\r", ch);
				return;
			}

			obj = get_obj_carry(ch, target_name, ch);

			if (obj == nullptr)
			{
				send_to_char("You are not carrying that.\n\r", ch);
				return;
			}

			vo = (void *)obj;
			target = TARGET_OBJ;
			break;
		case TAR_OBJ_CHAR_OFF:
			if (arg2[0] == '\0')
			{
				victim = ch->fighting;

				if (victim == nullptr)
				{
					send_to_char("Call the power on who or what?\n\r", ch);
					return;
				}

				target = TARGET_CHAR;
			}
			else
			{
				victim = get_char_room(ch, target_name);

				if (victim != nullptr)
					target = TARGET_CHAR;
			}

			if (target == TARGET_CHAR) /* check the sanity of the attack */
			{
				if (is_affected_by(ch, AFF_CHARM) && ch->master == victim)
				{
					send_to_char("You can't do that on your own follower.\n\r", ch);
					return;
				}

				vo = (void *)victim;
			}
			else if ((obj = get_obj_here(ch, target_name)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_OBJ_CHAR_DEF:
			if (arg2[0] == '\0')
			{
				vo = (void *)ch;
				target = TARGET_CHAR;
			}
			else if ((victim = get_char_room(ch, target_name)) != nullptr)
			{
				vo = (void *)victim;
				target = TARGET_CHAR;
			}
			else if ((obj = get_obj_carry(ch, target_name, ch)) != nullptr)
			{
				vo = (void *)obj;
				target = TARGET_OBJ;
			}
			else
			{
				send_to_char("You don't see that here.\n\r", ch);
				return;
			}

			break;
		case TAR_DIR:
			where = direction_lookup(target_name);
			pexit = ch->in_room->exit[where];

			if (where < 0 || !pexit)
			{
				send_to_char("That's not a valid direction.\n\r", ch);
				return;
			}

			vo = &where;
			target = TARGET_DIR;
			break;
		default:
			RS.Logger.Warn("Do_cast: bad target for sn {}.", sn);
			return;
	}

	if (!is_npc(ch) && ch->mana < mana)
	{
		send_to_char("You don't have enough mana.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, skill_table[sn].beats);

	if (!is_npc(ch) && (number_percent() > get_skill(ch, sn)))
	{
		send_to_char("You lost your concentration.\n\r", ch);

		if (sn != gsn_rage)
			check_improve(ch, sn, false, 1);

		ch->mana -= mana / 2;
	}
	else
	{
		ch->mana -= mana;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE && is_safe(ch, victim))
			return;

		if (skill_table[sn].target == TAR_CHAR_OFFENSIVE)
		{
			if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
			{
				switch (number_range(0, 2))
				{
					case 0:
					case 1:
						sprintf(buf, "Die, %s you sorcerous dog!", pers(ch, victim));
						break;
					case 2:
						sprintf(buf, "Help! %s is casting a spell on me!", pers(ch, victim));
						break;
				}

				if (victim != ch && !is_npc(ch))
					do_myell(victim, buf, ch);
			}

			if (check_volley(ch, victim))
			{
				act("$N reflects your spell right back at you!", ch, 0, victim, TO_CHAR);
				act("You reflect $n's spell right back at $m!", ch, 0, victim, TO_VICT);
				act("$N reflects $n's spell right back at $m!", ch, 0, victim, TO_NOTVICT);
				(*skill_table[sn].spell_fun)(sn, ch->level * 2, victim, ch, target);
				return;
			}
		}

		(*skill_table[sn].spell_fun)(sn, ch->level, ch, vo, target);
		check_improve(ch, sn, true, 1);
	}

	if ((skill_table[sn].target == TAR_CHAR_OFFENSIVE
			|| (skill_table[sn].target == TAR_OBJ_CHAR_OFF && target == TARGET_CHAR))
		&& victim != ch
		&& victim->master != ch)
	{
		CHAR_DATA *vch;
		CHAR_DATA *vch_next;
		un_blade_barrier(ch, nullptr);

		for (vch = ch->in_room->people; vch; vch = vch_next)
		{
			vch_next = vch->next_in_room;

			if (victim == vch && victim->fighting == nullptr)
			{
				multi_hit(victim, ch, TYPE_UNDEFINED);
				break;
			}
		}
	}
}